

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

Script * cfd::GetLockingScriptFromUtxoData(UtxoData *utxo)

{
  byte bVar1;
  ulong uVar2;
  long in_RSI;
  Script *in_RDI;
  Descriptor desc;
  Script *locking_script;
  Script *this;
  Script local_220;
  Descriptor local_1e8;
  Script local_80;
  string local_38;
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  core::Script::Script(in_RDI,(Script *)(in_RSI + 0x50));
  core::Address::GetAddress_abi_cxx11_(&local_38,(Address *)(local_10 + 0xc0));
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_38);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      core::Descriptor::Parse
                (&local_1e8,(string *)(local_10 + 0x238),
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      core::Descriptor::GetLockingScript(&local_220,&local_1e8);
      core::Script::operator=(this,&local_220);
      core::Script::~Script(this);
      core::Descriptor::~Descriptor((Descriptor *)0x50e7fc);
    }
  }
  else {
    core::Address::GetLockingScript(&local_80,(Address *)(local_10 + 0xc0));
    core::Script::operator=(this,&local_80);
    core::Script::~Script(this);
  }
  return in_RDI;
}

Assistant:

static Script GetLockingScriptFromUtxoData(const UtxoData& utxo) {
  Script locking_script = utxo.locking_script;
  if (!utxo.address.GetAddress().empty()) {
    locking_script = utxo.address.GetLockingScript();
  } else if (!utxo.descriptor.empty()) {
    auto desc = Descriptor::Parse(utxo.descriptor);
    locking_script = desc.GetLockingScript();
  }
  return locking_script;
}